

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_generator_factory.cc
# Opt level: O0

ExtensionGenerator * __thiscall
google::protobuf::compiler::java::ImmutableGeneratorFactory::NewExtensionGenerator
          (ImmutableGeneratorFactory *this,FieldDescriptor *descriptor)

{
  bool bVar1;
  FileDescriptor *descriptor_00;
  FieldDescriptor *descriptor_local;
  ImmutableGeneratorFactory *this_local;
  
  descriptor_00 = FieldDescriptor::file(descriptor);
  bVar1 = Context::EnforceLite(this->context_);
  bVar1 = HasDescriptorMethods(descriptor_00,bVar1);
  if (bVar1) {
    this_local = (ImmutableGeneratorFactory *)operator_new(0x40);
    ImmutableExtensionGenerator::ImmutableExtensionGenerator
              ((ImmutableExtensionGenerator *)this_local,descriptor,this->context_);
  }
  else {
    this_local = (ImmutableGeneratorFactory *)operator_new(0x40);
    ImmutableExtensionLiteGenerator::ImmutableExtensionLiteGenerator
              ((ImmutableExtensionLiteGenerator *)this_local,descriptor,this->context_);
  }
  return (ExtensionGenerator *)this_local;
}

Assistant:

ExtensionGenerator* ImmutableGeneratorFactory::NewExtensionGenerator(
    const FieldDescriptor* descriptor) const {
  if (HasDescriptorMethods(descriptor->file(), context_->EnforceLite())) {
    return new ImmutableExtensionGenerator(descriptor, context_);
  } else {
    return new ImmutableExtensionLiteGenerator(descriptor, context_);
  }
}